

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O0

bool P_AddSectorLinks(sector_t_conflict *control,int tag,INTBOOL ceiling,int movetype)

{
  bool bVar1;
  linked *local_48;
  FSectorTagIterator local_3c;
  FSectorTagIterator itr;
  int sec;
  plane *scrollplane;
  int param;
  int movetype_local;
  INTBOOL ceiling_local;
  int tag_local;
  sector_t_conflict *control_local;
  
  if (((ceiling != 0) && (bVar1 = sector_t::PlaneMoving((sector_t *)control,1), bVar1)) ||
     ((ceiling == 0 && (bVar1 = sector_t::PlaneMoving((sector_t *)control,0), bVar1)))) {
    control_local._7_1_ = false;
  }
  else {
    scrollplane._4_4_ = movetype & 0xf;
    if ((movetype & 5U) == 4) {
      scrollplane._4_4_ = movetype & 0xb;
    }
    if ((scrollplane._4_4_ & 10) == 8) {
      scrollplane._4_4_ = scrollplane._4_4_ & 0xfffffff7;
    }
    if ((movetype == 0) || (scrollplane._4_4_ != 0)) {
      if (ceiling == 0) {
        local_48 = &control->e->Linked;
      }
      else {
        local_48 = (linked *)&(control->e->Linked).Ceiling;
      }
      stack0xffffffffffffffd0 = local_48;
      if (scrollplane._4_4_ == 0) {
        RemoveTaggedSectors(&local_48->Floor,tag);
      }
      else {
        FSectorTagIterator::FSectorTagIterator(&local_3c,tag);
        while (itr.searchtag = FSectorTagIterator::Next(&local_3c), -1 < itr.searchtag) {
          if (control != sectors + itr.searchtag) {
            AddSingleSector(&stack0xffffffffffffffd0->Floor,sectors + itr.searchtag,
                            scrollplane._4_4_);
          }
        }
      }
      control_local._7_1_ = true;
    }
    else {
      control_local._7_1_ = false;
    }
  }
  return control_local._7_1_;
}

Assistant:

bool P_AddSectorLinks(sector_t *control, int tag, INTBOOL ceiling, int movetype)
{
	int param = movetype;

	// can't be done if the control sector is moving.
	if ((ceiling && control->PlaneMoving(sector_t::ceiling)) || 
		(!ceiling && control->PlaneMoving(sector_t::floor))) return false;

	// Make sure we have only valid combinations
	movetype &= LINK_FLAGMASK;
	if ((movetype & LINK_FLOORMIRROR) == LINK_FLOORMIRRORFLAG) movetype &= ~LINK_FLOORMIRRORFLAG;
	if ((movetype & LINK_CEILINGMIRROR) == LINK_CEILINGMIRRORFLAG) movetype &= ~LINK_CEILINGMIRRORFLAG;

	// Don't remove any sector if the parameter is invalid.
	// Addition may still be performed based on the given value.
	if (param != 0 && movetype == 0) return false;

	extsector_t::linked::plane &scrollplane = ceiling? control->e->Linked.Ceiling : control->e->Linked.Floor;

	if (movetype > 0)
	{
		int sec;
		FSectorTagIterator itr(tag);
		while ((sec = itr.Next()) >= 0)
		{
			// Don't attach to self!
			if (control != &sectors[sec])
			{
				AddSingleSector(scrollplane, &sectors[sec], movetype);
			}
		}
	}
	else
	{
		RemoveTaggedSectors(scrollplane, tag);
	}
	return true;
}